

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

InnerProductLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::InnerProductLayerParams>
          (Arena *arena)

{
  InnerProductLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this,(Arena *)0x0,false)
    ;
  }
  else {
    this = (InnerProductLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x38,
                      (type_info *)&CoreML::Specification::InnerProductLayerParams::typeinfo);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }